

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O1

void __thiscall PKCS12Test_TestWindows_Test::TestBody(PKCS12Test_TestWindows_Test *this)

{
  Span<const_unsigned_char> der;
  string data;
  string local_28;
  
  GetTestData_abi_cxx11_(&local_28,"crypto/pkcs8/test/windows.p12");
  der.size_ = local_28._M_string_length;
  der.data_ = (uchar *)local_28._M_dataplus._M_p;
  TestImpl("Windows",der,"foo",(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PKCS12Test, TestWindows) {
  // windows.p12 is a dummy key and certificate exported from the certificate
  // manager on Windows 7. It has a friendlyName, but only on the key, where we
  // ignore it, and not the certificate.
  std::string data = GetTestData("crypto/pkcs8/test/windows.p12");
  TestImpl("Windows", bssl::StringAsBytes(data), kPassword, nullptr);
}